

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

void __thiscall QDebug::Stream::Stream(Stream *this,QString *string)

{
  QTextStream::QTextStream(&this->ts,string,(OpenMode)0x2);
  (this->buffer).d.d = (Data *)0x0;
  (this->buffer).d.ptr = (char16_t *)0x0;
  (this->buffer).d.size = 0;
  this->ref = 1;
  this->type = QtDebugMsg;
  this->space = true;
  this->noQuotes = false;
  this->message_output = false;
  this->verbosity = 2;
  (this->context).version = 2;
  *(undefined8 *)&(this->context).line = 0;
  *(undefined8 *)((long)&(this->context).file + 4) = 0;
  (this->context).function = (char *)0x0;
  (this->context).category = (char *)0x0;
  return;
}

Assistant:

explicit Stream(QString *string)
            : ts(string, WriteOnly)
        {}